

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_fxrem(sexp ctx,sexp a,sexp_sint_t b)

{
  sexp_uint_t sVar1;
  ulong uVar2;
  long lVar3;
  sexp psVar4;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  sexp_uint_t sVar8;
  
  sVar1 = (a->value).string.offset;
  do {
    sVar8 = sVar1;
    if (sVar8 == 1) break;
    sVar1 = sVar8 - 1;
  } while (*(long *)((long)&a->value + sVar8 * 8 + 8) == 0);
  if ((b < 1) ||
     (uVar2 = b - ((ulong)b >> 1 & 0x5555555555555555),
     uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333),
     1 < (byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
    lVar6 = -b;
    if (0 < b) {
      lVar6 = b;
    }
    if (b == 0) {
      psVar4 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
      return psVar4;
    }
    if ((int)sVar8 + -1 < 0) {
      lVar3 = 0;
    }
    else {
      puVar5 = (undefined8 *)((long)&a->value + (sVar8 - 1 & 0xffffffff) * 8 + 0x10);
      lVar3 = 0;
      do {
        lVar3 = __umodti3(*puVar5,lVar3,lVar6,0);
        puVar5 = puVar5 + -1;
        uVar7 = (int)sVar8 - 1;
        sVar8 = (sexp_uint_t)uVar7;
      } while (uVar7 != 0);
      lVar3 = lVar3 * 2;
    }
    psVar4 = (sexp)((a->value).flonum_bits[0] * lVar3 | 1);
  }
  else {
    psVar4 = (sexp)((b - 1U & (a->value).string.length) * (long)(a->value).flonum_bits[0] * 2 + 1);
  }
  return psVar4;
}

Assistant:

sexp sexp_bignum_fxrem (sexp ctx, sexp a, sexp_sint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, b0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  if (b > 0) {
    q = b - 1;
    if ((b & q) == 0)
      return sexp_make_fixnum(sexp_bignum_sign(a) * (data[0] & q));
  }
  b0 = (b >= 0) ? b : -b;
  if (b0 == 0) {
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  }
  for (i=len-1; i>=0; i--) {
    n = luint_add(luint_shl(n, sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b0));
    n = luint_sub(n, luint_mul_uint(luint_from_uint(q), b0));
  }
  return sexp_make_fixnum(sexp_bignum_sign(a) * (sexp_sint_t)luint_to_uint(n));
}